

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlUnregisterInputCallback(PyObject *self,PyObject *args)

{
  PyObject *pPVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  iVar2 = xmlPopInputCallbacks();
  pPVar1 = pythonInputOpenCallbackObject;
  if (pythonInputCallbackID == -1) {
    if (iVar2 == -1) {
      pcVar3 = "no input callbacks to pop";
      uVar4 = _PyExc_IndexError;
      goto LAB_0013b76d;
    }
  }
  else {
    if (pythonInputCallbackID != iVar2) {
      pcVar3 = "popped non-python input callback";
      uVar4 = _PyExc_AssertionError;
LAB_0013b76d:
      PyErr_SetString(uVar4,pcVar3);
      return (PyObject *)0x0;
    }
    pythonInputCallbackID = -1;
    pythonInputOpenCallbackObject->ob_refcnt = pythonInputOpenCallbackObject->ob_refcnt + -1;
    if (pPVar1->ob_refcnt == 0) {
      _Py_Dealloc();
    }
    pythonInputOpenCallbackObject = (PyObject *)0x0;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlUnregisterInputCallback(ATTRIBUTE_UNUSED PyObject *self,
                                ATTRIBUTE_UNUSED PyObject *args) {
    int ret;

    ret = xmlPopInputCallbacks();
    if (pythonInputCallbackID != -1) {
	/* Assert that the right input callback was popped. libxml's API does not
	 * allow removal by ID, so all that could be done is an assert.  */
	if (pythonInputCallbackID == ret) {
	    pythonInputCallbackID = -1;
	    Py_DECREF(pythonInputOpenCallbackObject);
	    pythonInputOpenCallbackObject = NULL;
	} else {
	    PyErr_SetString(PyExc_AssertionError, "popped non-python input callback");
	    return(NULL);
	}
    } else if (ret == -1) {
	/* No more callbacks to pop */
	PyErr_SetString(PyExc_IndexError, "no input callbacks to pop");
	return(NULL);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}